

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::LdExp::doApply
          (Interval *__return_storage_ptr__,LdExp *this,EvalContext *ctx,IArgs *iargs)

{
  IArg0 *arg0;
  IArg0 *arg0_00;
  bool bVar1;
  bool bVar2;
  float fVar3;
  Void local_8a;
  Void local_89;
  Interval local_88;
  Interval local_70;
  Interval local_58;
  Void local_3b;
  Void local_3a;
  Void local_39;
  undefined1 local_38 [8];
  Interval ret;
  IArgs *iargs_local;
  EvalContext *ctx_local;
  LdExp *this_local;
  
  arg0 = iargs->b;
  ret.m_hi = (double)iargs;
  Void::Void(&local_39);
  Void::Void(&local_3a);
  Void::Void(&local_3b);
  call<deqp::gls::BuiltinPrecisionTests::Functions::Exp2>
            ((IRet *)local_38,ctx,arg0,&local_39,&local_3a,&local_3b);
  fVar3 = std::numeric_limits<float>::infinity();
  tcu::Interval::Interval(&local_58,(double)fVar3);
  bVar1 = tcu::Interval::contains((Interval *)local_38,&local_58);
  fVar3 = std::numeric_limits<float>::infinity();
  tcu::Interval::Interval(&local_70,(double)-fVar3);
  bVar2 = tcu::Interval::contains((Interval *)local_38,&local_70);
  if (bVar1 || bVar2) {
    fVar3 = std::numeric_limits<float>::quiet_NaN();
    tcu::Interval::Interval(&local_88,(double)fVar3);
    tcu::Interval::operator|=((Interval *)local_38,&local_88);
  }
  arg0_00 = *(IArg0 **)ret.m_hi;
  Void::Void(&local_89);
  Void::Void(&local_8a);
  call<deqp::gls::BuiltinPrecisionTests::Functions::Mul>
            (__return_storage_ptr__,ctx,arg0_00,(IArg1 *)local_38,&local_89,&local_8a);
  return __return_storage_ptr__;
}

Assistant:

Interval	doApply			(const EvalContext& ctx, const IArgs& iargs) const
	{
		Interval	ret = call<Exp2>(ctx, iargs.b);
		// Khronos bug 11180 consensus: if exp2(exponent) cannot be represented,
		// the result is undefined.

		if (ret.contains(TCU_INFINITY) | ret.contains(-TCU_INFINITY))
			ret |= TCU_NAN;

		return call<Mul>(ctx, iargs.a, ret);
	}